

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O1

void m_dowear_type(level *lev,monst *mon,long flag,boolean creation,boolean racialexception)

{
  uint uVar1;
  obj *obj;
  boolean bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  uchar uVar11;
  obj *otmp;
  obj *obj_00;
  obj *obj_01;
  uint uVar12;
  char buf [256];
  char nambuf [256];
  char local_238 [256];
  char local_138 [264];
  
  if (mon->wormno == '\0') {
    if (((viz_array[mon->my][mon->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((uVar12 = 1, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (uVar12 = 1, ((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((uVar12 = 1, (viz_array[mon->my][mon->mx] & 1U) != 0 && ((mon->data->mflags3 & 0x200) != 0)
         ))))) goto LAB_0028bbf9;
  }
  else {
    bVar2 = worm_known(lev,mon);
    if (bVar2 == '\0') {
      uVar12 = 1;
    }
    else {
LAB_0028bbf9:
      uVar7 = *(uint *)&mon->field_0x60;
      if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        uVar12 = 1;
        if (-1 < (char)uVar7) goto LAB_0028bc44;
      }
      else {
        uVar12 = 1;
        if ((-1 < (char)uVar7) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028bc44:
          uVar12 = 1;
          if ((uVar7 >> 9 & 1) == 0) {
            uVar12 = (uint)u._1052_4_ >> 5 & 1;
          }
        }
      }
    }
  }
  if (mon->mfrozen != '\0') {
    return;
  }
  if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
     (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
    pcVar8 = mon_nam(mon);
  }
  else {
    pcVar8 = Monnam(mon);
  }
  strcpy(local_138,pcVar8);
  obj_01 = (obj *)&mon->minvent;
  do {
    obj_01 = obj_01->nobj;
    if (obj_01 == (obj *)0x0) {
      obj_01 = (obj *)0x0;
      break;
    }
  } while ((obj_01->owornmask & flag) == 0);
  if (obj_01 != (obj *)0x0) {
    if (flag == 0x10000) {
      return;
    }
    if ((*(uint *)&obj_01->field_0x4a & 1) != 0) {
      return;
    }
  }
  otmp = obj_01;
  for (obj = mon->minvent; obj_00 = otmp, obj != (obj *)0x0; obj = obj->nobj) {
    if (flag < 0x10) {
      switch(flag) {
      case 1:
        if ((obj->oclass != '\x03') ||
           ((objects[obj->otyp].oc_subtyp != '\0' ||
            ((racialexception != '\0' && (iVar3 = racial_exception(mon,obj), iVar3 == 0))))))
        goto LAB_0028bfa9;
        break;
      case 2:
        if ((obj->oclass != '\x03') || (objects[obj->otyp].oc_subtyp != '\x05')) goto LAB_0028bfa9;
        break;
      case 4:
        if (((obj->oclass != '\x03') || (objects[obj->otyp].oc_subtyp != '\x02')) ||
           (((iVar3 = num_horns(mon->data), 0 < iVar3 && ((long)obj->otyp != 0x3d)) &&
            ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x180) != 0)))) goto LAB_0028bfa9;
        break;
      case 8:
        if ((obj->oclass != '\x03') || (objects[obj->otyp].oc_subtyp != '\x01')) goto LAB_0028bfa9;
      }
switchD_0028bd44_caseD_3:
      if (obj->owornmask == 0) {
        if (otmp != (obj *)0x0) {
          iVar3 = arm_bonus(otmp,mon);
          iVar4 = extra_pref(mon,otmp);
          iVar5 = arm_bonus(obj,mon);
          iVar6 = extra_pref(mon,obj);
          if (iVar6 + iVar5 <= iVar4 + iVar3) goto LAB_0028bfa9;
        }
        otmp = obj;
      }
    }
    else if (flag < 0x40) {
      if (flag == 0x10) {
        if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x03'))
        goto switchD_0028bd44_caseD_3;
      }
      else if ((flag != 0x20) ||
              ((obj->oclass == '\x03' && (objects[obj->otyp].oc_subtyp == '\x04'))))
      goto switchD_0028bd44_caseD_3;
    }
    else if (flag == 0x40) {
      if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x06'))
      goto switchD_0028bd44_caseD_3;
    }
    else {
      if (flag != 0x10000) goto switchD_0028bd44_caseD_3;
      if ((obj->oclass == '\x05') &&
         (((obj_00 = obj, obj->otyp == 0xca || (obj->otyp == 0xd0)) || ((obj->oprops & 0x10) != 0)))
         ) break;
    }
LAB_0028bfa9:
  }
  if (obj_00 == obj_01 || obj_00 == (obj *)0x0) {
    return;
  }
  if ((flag == 0x40) || (bVar10 = 0, flag == 1)) {
    bVar10 = (byte)mon->misc_worn_check & 2;
  }
  if (obj_01 != (obj *)0x0) {
    bVar10 = bVar10 + objects[obj_01->otyp].oc_delay;
    obj_01->owornmask = 0;
  }
  if (creation == '\0') {
    if (mon->wormno == '\0') {
      if (((viz_array[mon->my][mon->mx] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
            (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          (((viz_array[mon->my][mon->mx] & 1U) != 0 && ((mon->data->mflags3 & 0x200) != 0))))))
      goto LAB_0028c103;
    }
    else {
      bVar2 = worm_known(lev,mon);
      if (bVar2 != '\0') {
LAB_0028c103:
        uVar7 = *(uint *)&mon->field_0x60;
        if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar7 & 0x280) == 0) goto LAB_0028c15a;
        }
        else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028c15a:
          if ((u._1052_4_ & 0x20) == 0) {
            if (obj_01 == (obj *)0x0) {
              local_238[0] = '\0';
            }
            else {
              pcVar8 = distant_name(obj_01,doname);
              sprintf(local_238," removes %s and",pcVar8);
            }
            pcVar8 = Monnam(mon);
            pcVar9 = distant_name(obj_00,doname);
            pline("%s%s puts on %s.",pcVar8,local_238,pcVar9);
          }
        }
      }
    }
    uVar11 = bVar10 + objects[obj_00->otyp].oc_delay;
    mon->mfrozen = uVar11;
    if (uVar11 != '\0') {
      mon->field_0x62 = mon->field_0x62 & 0xfb;
    }
  }
  if (obj_01 != (obj *)0x0) {
    update_mon_intrinsics(lev,mon,obj_01,'\0',creation);
  }
  mon->misc_worn_check = mon->misc_worn_check | (uint)flag;
  obj_00->owornmask = obj_00->owornmask | (uint)flag;
  update_mon_intrinsics(lev,mon,obj_00,'\x01',creation);
  if (creation != '\0') {
    return;
  }
  if (mon->wormno == '\0') {
    if (((viz_array[mon->my][mon->mx] & 2U) == 0) &&
       ((((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
           || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
          ((uVar7 = 1, ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (uVar7 = 1, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        ((uVar7 = 1, (viz_array[mon->my][mon->mx] & 1U) == 0 || ((mon->data->mflags3 & 0x200) == 0))
        )))) goto LAB_0028c3ab;
  }
  else {
    bVar2 = worm_known(lev,mon);
    if (bVar2 == '\0') {
      uVar7 = 1;
      goto LAB_0028c3ab;
    }
  }
  uVar1 = *(uint *)&mon->field_0x60;
  if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    uVar7 = 1;
    if ((char)uVar1 < '\0') goto LAB_0028c3ab;
  }
  else {
    uVar7 = 1;
    if (((char)uVar1 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0)) goto LAB_0028c3ab;
  }
  uVar7 = 1;
  if ((uVar1 >> 9 & 1) == 0) {
    uVar7 = (uint)u._1052_4_ >> 5 & 1;
  }
LAB_0028c3ab:
  if (((uVar12 != uVar7) && ((mon->field_0x60 & 2) != 0)) &&
     ((u.uprops[0xc].intrinsic == 0 &&
      ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))))) {
    pline("Suddenly you cannot see %s.",local_138);
    discover_object((int)obj_00->otyp,'\x01','\x01');
  }
  return;
}

Assistant:

static void m_dowear_type(struct level *lev, struct monst *mon, long flag,
			  boolean creation, boolean racialexception)
{
	struct obj *old, *best, *obj;
	int m_delay = 0;
	int unseen = !canseemon(lev, mon);
	char nambuf[BUFSZ];

	if (mon->mfrozen) return; /* probably putting previous item on */

	/* Get a copy of monster's name before altering its visibility */
	strcpy(nambuf, See_invisible ? Monnam(mon) : mon_nam(mon));

	old = which_armor(mon, flag);
	if (old && old->cursed) return;
	if (old && flag == W_AMUL) return; /* no such thing as better amulets */
	best = old;

	for (obj = mon->minvent; obj; obj = obj->nobj) {
	    switch(flag) {
		case W_AMUL:
		    if (obj->oclass != AMULET_CLASS ||
			    (obj->otyp != AMULET_OF_LIFE_SAVING &&
				obj->otyp != AMULET_OF_REFLECTION &&
				!(obj->oprops & ITEM_REFLECTION)))
			continue;
		    best = obj;
		    goto outer_break; /* no such thing as better amulets */
		case W_ARMU:
		    if (!is_shirt(obj)) continue;
		    break;
		case W_ARMC:
		    if (!is_cloak(obj)) continue;
		    break;
		case W_ARMH:
		    if (!is_helmet(obj)) continue;
		    /* (flimsy exception matches polyself handling) */
		    if (has_horns(mon->data) && !is_flimsy(obj)) continue;
		    break;
		case W_ARMS:
		    if (!is_shield(obj)) continue;
		    break;
		case W_ARMG:
		    if (!is_gloves(obj)) continue;
		    break;
		case W_ARMF:
		    if (!is_boots(obj)) continue;
		    break;
		case W_ARM:
		    if (!is_suit(obj)) continue;
		    if (racialexception && (racial_exception(mon, obj) < 1)) continue;
		    break;
	    }
	    if (obj->owornmask) continue;
	    /* I'd like to define a VISIBLE_ARM_BONUS which doesn't assume the
	     * monster knows obj->spe, but if I did that, a monster would keep
	     * switching forever between two -2 caps since when it took off one
	     * it would forget spe and once again think the object is better
	     * than what it already has.
	     */
	    if (best && (arm_bonus(best, mon) + extra_pref(mon, best) >=
			 arm_bonus(obj, mon) + extra_pref(mon, obj)))
		continue;
	    best = obj;
	}
outer_break:
	if (!best || best == old) return;

	/* if wearing a cloak, account for the time spent removing
	   and re-wearing it when putting on a suit or shirt */
	if ((flag == W_ARM || flag == W_ARMU) && (mon->misc_worn_check & W_ARMC))
	    m_delay += 2;
	/* when upgrading a piece of armor, account for time spent
	   taking off current one */
	if (old)
	    m_delay += objects[old->otyp].oc_delay;

	if (old) /* do this first to avoid "(being worn)" */
	    old->owornmask = 0L;
	if (!creation) {
	    if (canseemon(lev, mon)) {
		char buf[BUFSZ];

		if (old)
		    sprintf(buf, " removes %s and", distant_name(old, doname));
		else
		    buf[0] = '\0';
		pline("%s%s puts on %s.", Monnam(mon),
		      buf, distant_name(best,doname));
	    } /* can see it */
	    m_delay += objects[best->otyp].oc_delay;
	    mon->mfrozen = m_delay;
	    if (mon->mfrozen) mon->mcanmove = 0;
	}
	if (old)
	    update_mon_intrinsics(lev, mon, old, FALSE, creation);
	mon->misc_worn_check |= flag;
	best->owornmask |= flag;
	update_mon_intrinsics(lev, mon, best, TRUE, creation);
	/* if couldn't see it but now can, or vice versa, */
	if (!creation && (unseen ^ !canseemon(lev, mon))) {
		if (mon->minvis && !See_invisible) {
			pline("Suddenly you cannot see %s.", nambuf);
			makeknown(best->otyp);
		} /* else if (!mon->minvis) pline("%s suddenly appears!", Amonnam(mon)); */
	}
}